

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O1

void __thiscall
COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputSemantic::Semantic>::reallocMemory
          (ArrayPrimitiveType<COLLADASaxFWL::InputSemantic::Semantic> *this,size_t minCapacity)

{
  Semantic *pSVar1;
  ulong uVar2;
  
  if (this->mCapacity < minCapacity) {
    uVar2 = (this->mCapacity * 3 >> 1) + 1;
    if (uVar2 <= minCapacity) {
      uVar2 = minCapacity;
    }
    this->mCapacity = uVar2;
    if (this->mData == (Semantic *)0x0) {
      pSVar1 = (Semantic *)malloc(uVar2 * 4);
      this->mData = pSVar1;
      this->mCount = 0;
      this->mCapacity = uVar2;
    }
    else {
      pSVar1 = (Semantic *)realloc(this->mData,uVar2 * 4);
      this->mData = pSVar1;
      if (this->mCapacity < this->mCount) {
        this->mCount = this->mCapacity;
      }
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}